

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O3

void D_ProcessEvents(void)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  IJoystickConfig *selected;
  long lVar4;
  event_t *ev;
  
  iVar1 = testingmode;
  if (testingmode == 1) {
    M_SetDefaultMode();
    return;
  }
  if (testingmode == 0) {
    if (eventtail != eventhead) {
      do {
        lVar4 = (long)eventtail;
        if (events[lVar4].type != '\0') {
          if (events[lVar4].type == '\x05') {
            selected = I_UpdateDeviceList();
            UpdateJoystickMenu(selected);
          }
          ev = events + lVar4;
          bVar2 = C_Responder(ev);
          if ((!bVar2) && (bVar2 = M_Responder(ev), !bVar2)) {
            G_Responder(ev);
          }
        }
        eventtail = eventtail + 1U & 0x7f;
      } while (eventtail != eventhead);
    }
  }
  else {
    iVar3 = (*I_GetTime)(false);
    if (iVar1 <= iVar3) {
      M_RestoreMode();
      return;
    }
  }
  return;
}

Assistant:

void D_ProcessEvents (void)
{
	event_t *ev;
		
	// [RH] If testing mode, do not accept input until test is over
	if (testingmode)
	{
		if (testingmode == 1)
		{
			M_SetDefaultMode ();
		}
		else if (testingmode <= I_GetTime(false))
		{
			M_RestoreMode ();
		}
		return;
	}

	for (; eventtail != eventhead ; eventtail = (eventtail+1)&(MAXEVENTS-1))
	{
		ev = &events[eventtail];
		if (ev->type == EV_None)
			continue;
		if (ev->type == EV_DeviceChange)
			UpdateJoystickMenu(I_UpdateDeviceList());
		if (C_Responder (ev))
			continue;				// console ate the event
		if (M_Responder (ev))
			continue;				// menu ate the event
		G_Responder (ev);
	}
}